

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  uint in_R9D;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  if (s == end) {
    return (Result)Error;
  }
  if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
    s = s + 2;
    if (s == end) {
      return (Result)Error;
    }
    if (s < end) {
      uVar2 = 0;
      do {
        iVar3 = (int)*s;
        uVar6 = 4;
        if (iVar3 != 0x5f) {
          if (iVar3 - 0x30U < 10) {
            bVar7 = false;
            uVar5 = iVar3 - 0x30U;
          }
          else if (iVar3 - 0x61U < 6) {
            bVar7 = false;
            uVar5 = iVar3 - 0x57;
          }
          else {
            bVar7 = iVar3 - 0x47U < 0xfffffffa;
            uVar5 = iVar3 - 0x37;
            if (bVar7) {
              uVar5 = in_R9D;
            }
          }
          uVar6 = 1;
          in_R9D = uVar5;
          if (((!bVar7) && (uVar2 < 0x1000000000000000)) &&
             (uVar2 != 0xfffffffffffffff || uVar5 < 0x10)) {
            uVar2 = uVar2 * 0x10 + (ulong)uVar5;
            uVar6 = 0;
          }
        }
        if ((uVar6 & 3) != 0) goto LAB_0015bc1d;
        s = s + 1;
      } while (s != end);
      uVar6 = 0;
      s = end;
LAB_0015bc1d:
      bVar7 = uVar6 == 0;
    }
    else {
      bVar7 = true;
      uVar2 = 0;
    }
    if (!bVar7) {
      return (Result)Error;
    }
  }
  else {
    bVar7 = s < end;
    if (bVar7) {
      uVar2 = 0;
      pcVar4 = s;
      do {
        s = pcVar4;
        if (*s != 0x5f) {
          uVar6 = (int)*s - 0x30;
          bVar1 = false;
          if ((uVar6 < 10) && (bVar1 = false, uVar2 < 0x199999999999999a)) {
            if ((uVar2 == 0x1999999999999999) && (5 < uVar6)) {
              bVar1 = false;
            }
            else {
              uVar2 = (ulong)uVar6 + uVar2 * 10;
              bVar1 = true;
            }
          }
          if (!bVar1) break;
        }
        pcVar4 = s + 1;
        bVar7 = pcVar4 < end;
        s = end;
      } while (pcVar4 != end);
    }
    else {
      uVar2 = 0;
    }
    if (bVar7) {
      return (Result)Error;
    }
  }
  if (s == end) {
    *out = uVar2;
  }
  return (Result)(uint)(s != end);
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    constexpr uint64_t kMaxDiv16 = UINT64_MAX / 16;
    constexpr uint64_t kMaxMod16 = UINT64_MAX % 16;
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      // Check for overflow.
      if (value > kMaxDiv16 || (value == kMaxDiv16 && digit > kMaxMod16)) {
        return Result::Error;
      }
      value = value * 16 + digit;
    }
  } else {
    constexpr uint64_t kMaxDiv10 = UINT64_MAX / 10;
    constexpr uint64_t kMaxMod10 = UINT64_MAX % 10;
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      // Check for overflow.
      if (value > kMaxDiv10 || (value == kMaxDiv10 && digit > kMaxMod10)) {
        return Result::Error;
      }
      value = value * 10 + digit;
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}